

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

bool __thiscall gmlc::networking::TcpServer::reConnect(TcpServer *this,milliseconds timeOut)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  ulong uVar8;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  undefined8 uVar9;
  pointer psVar10;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  LOCK();
  (this->halted)._M_base._M_i = false;
  UNLOCK();
  psVar10 = (this->acceptors).
            super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->acceptors).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar3) {
    paVar2 = &local_50.field_2;
    uVar7 = 0;
    do {
      uVar8 = CONCAT71((int7)(uVar7 >> 8),1);
      if ((((psVar10->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr)->state)._M_i != CONNECTED) {
        iVar5 = TcpAcceptor::connect
                          ((psVar10->
                           super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,(int)timeOut.__r,in_RDX,(socklen_t)uVar8);
        uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
        in_RDX = extraout_RDX;
        if ((char)iVar5 == '\0') {
          local_50._M_dataplus._M_p = (pointer)paVar2;
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unable to connect on ","");
            TcpAcceptor::to_string_abi_cxx11_
                      (&local_70,
                       (psVar10->
                       super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar2) {
              uVar9 = local_50.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_70._M_string_length + local_50._M_string_length) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                uVar9 = local_70.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_70._M_string_length + local_50._M_string_length)
              goto LAB_00422846;
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_70,0,0,local_50._M_dataplus._M_p,local_50._M_string_length)
              ;
            }
            else {
LAB_00422846:
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_50,local_70._M_dataplus._M_p,local_70._M_string_length);
            }
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar6->_M_dataplus)._M_p;
            paVar1 = &pbVar6->field_2;
            if (paVar4 == paVar1) {
              local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            }
            else {
              local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_90._M_dataplus._M_p = (pointer)paVar4;
            }
            local_90._M_string_length = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar6->_M_string_length = 0;
            paVar1->_M_local_buf[0] = '\0';
            logger(this,0,&local_90);
            in_RDX = extraout_RDX_01;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unable to connect all acceptors on ","");
            TcpAcceptor::to_string_abi_cxx11_
                      (&local_70,
                       (psVar10->
                       super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar2) {
              uVar9 = local_50.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_70._M_string_length + local_50._M_string_length) {
              uVar9 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                uVar9 = local_70.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar9 < local_70._M_string_length + local_50._M_string_length)
              goto LAB_004227c8;
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_70,0,0,local_50._M_dataplus._M_p,local_50._M_string_length)
              ;
            }
            else {
LAB_004227c8:
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_50,local_70._M_dataplus._M_p,local_70._M_string_length);
            }
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar6->_M_dataplus)._M_p;
            paVar1 = &pbVar6->field_2;
            if (paVar4 == paVar1) {
              local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            }
            else {
              local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_90._M_dataplus._M_p = (pointer)paVar4;
            }
            local_90._M_string_length = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar6->_M_string_length = 0;
            paVar1->_M_local_buf[0] = '\0';
            logger(this,0,&local_90);
            in_RDX = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            in_RDX = extraout_RDX_02;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            in_RDX = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            in_RDX = extraout_RDX_04;
          }
          LOCK();
          (this->halted)._M_base._M_i = true;
          UNLOCK();
          uVar8 = uVar7 & 0xffffffff;
        }
      }
      psVar10 = psVar10 + 1;
      uVar7 = uVar8;
    } while (psVar10 != psVar3);
    if (((this->halted)._M_base._M_i & (byte)uVar8) != 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"partial connection on acceptor","");
      logger(this,0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (bool)(~(this->halted)._M_base._M_i & 1);
}

Assistant:

bool TcpServer::reConnect(std::chrono::milliseconds timeOut)
{
    halted = false;
    bool partialConnect = false;
    for (auto& acc : acceptors) {
        if (!acc->isConnected()) {
            if (!acc->connect(timeOut)) {
                if (partialConnect) {
                    logger(
                        0,
                        std::string("unable to connect all acceptors on ") +
                            acc->to_string());
                } else {
                    logger(
                        0,
                        std::string("unable to connect on ") +
                            acc->to_string());
                }

                halted = true;
                continue;
            }
        }
        partialConnect = true;
    }
    if ((halted.load()) && (partialConnect)) {
        logger(0, "partial connection on acceptor");
    }
    return !halted;
}